

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_b978c2::cmCMakeLanguageCommandCALL
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               string *callCommand,size_t startArg,optional<(anonymous_namespace)::Defer> *defer,
               cmExecutionStatus *status)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  string *psVar4;
  cmExecutionStatus *pcVar5;
  bool bVar6;
  bool bVar7;
  static_string_view *psVar8;
  cmListFileContext *pcVar9;
  ulong uVar10;
  string *psVar11;
  size_t sVar12;
  cmMakefile *this;
  pointer pcVar13;
  long lVar14;
  size_t i;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> funcArgs;
  cmListFileFunction func;
  string cmd;
  cmListFileContext context;
  undefined1 local_221;
  string local_220;
  undefined8 local_200;
  char *local_1f8;
  string *local_1f0;
  string *local_1e8;
  cmExecutionStatus *local_1e0;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_1d8;
  cmListFileFunction local_1b8;
  cmListFileFunction local_1a8;
  cmMakefile *local_198;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f0;
  bool local_d0;
  cmListFileContext local_c8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_58;
  pointer local_38;
  
  local_1e8 = callCommand;
  cmsys::SystemTools::LowerCase(&local_110,callCommand);
  psVar8 = std::
           __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((anonymous_namespace)::InvalidCommands,
                      (anonymous_namespace)::InvalidDeferCommands,&local_110);
  if (psVar8 == (static_string_view *)(anonymous_namespace)::InvalidDeferCommands) {
    if ((defer->super__Optional_base<(anonymous_namespace)::Defer,_false,_false>)._M_payload.
        super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged == true) {
      psVar8 = std::
               __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((anonymous_namespace)::InvalidDeferCommands,
                          &cmsys::SystemToolsManagerInstance,&local_110);
      if (psVar8 != (static_string_view *)&cmsys::SystemToolsManagerInstance) {
        local_c8.Name.field_2._8_8_ = (local_1e8->_M_dataplus)._M_p;
        local_c8.Name.field_2._M_allocated_capacity = local_1e8->_M_string_length;
        local_c8.Name._M_dataplus._M_p = (pointer)0x1b;
        local_c8.Name._M_string_length = 0x6f050c;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_c8;
        cmCatViews_abi_cxx11_(&local_220,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002c08f2;
      }
    }
    local_198 = status->Makefile;
    cmMakefile::GetBacktrace(local_198);
    pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_220);
    cmListFileContext::cmListFileContext(&local_c8,pcVar9);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length);
    }
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0 = (string *)defer;
    local_1e0 = status;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
              (&local_1d8,
               ((long)(args->
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
               startArg);
    pcVar13 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(args->
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pcVar13 >> 4) *
             -0x5555555555555555;
    if (startArg <= uVar10 && uVar10 - startArg != 0) {
      lVar14 = startArg * 0x30;
      do {
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter_const&,long&>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pcVar13->Value)._M_dataplus._M_p + lVar14),
                   (Delimiter *)((long)&pcVar13->Delim + lVar14),&local_c8.Line);
        startArg = startArg + 1;
        pcVar13 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x30;
      } while (startArg <
               (ulong)(((long)(args->
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar13 >> 4) *
                      -0x5555555555555555));
    }
    pcVar1 = (local_1e8->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + local_1e8->_M_string_length);
    local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_190._M_dataplus._M_p = (pointer)local_c8.Line;
    local_38 = (pointer)local_c8.Line;
    local_220._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_220._M_string_length,
               (Implementation **)&local_220,
               (allocator<cmListFileFunction::Implementation> *)&local_221,&local_130,
               (long *)&local_190,(long *)&local_38,&local_58);
    this = local_198;
    sVar3 = local_220._M_string_length;
    _Var2._M_p = local_220._M_dataplus._M_p;
    local_1a8.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_220._M_dataplus._M_p;
    local_1a8.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0x48] == (string)0x1) {
      sVar12 = *(size_t *)(local_1f0 + 8);
      if (sVar12 == 0) {
        cmMakefile::NewDeferId_abi_cxx11_(&local_220,this);
        std::__cxx11::string::operator=(local_1f0,(string *)&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        sVar12 = *(size_t *)(local_1f0 + 8);
      }
      psVar4 = local_1f0;
      if (*(long *)(local_1f0 + 0x28) != 0) {
        value._M_str = *(char **)local_1f0;
        value._M_len = sVar12;
        cmMakefile::AddDefinition(this,(string *)(local_1f0 + 0x20),value);
        sVar12 = *(size_t *)(psVar4 + 8);
      }
      if (*(cmMakefile **)(psVar4 + 0x40) != (cmMakefile *)0x0) {
        this = *(cmMakefile **)(psVar4 + 0x40);
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,*(long *)psVar4,sVar12 + *(long *)psVar4);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_c8.FilePath._M_dataplus._M_p,
                 local_c8.FilePath._M_dataplus._M_p + local_c8.FilePath._M_string_length);
      pcVar5 = local_1e0;
      local_1b8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var2._M_p;
      local_1b8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(sVar3 + 8) = *(_Atomic_word *)(sVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(sVar3 + 8) = *(_Atomic_word *)(sVar3 + 8) + 1;
        }
      }
      bVar7 = cmMakefile::DeferCall(this,&local_150,&local_170,&local_1b8);
      if (local_1b8.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      bVar6 = true;
      if (!bVar7) {
        psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_220.field_2._8_8_ = (psVar11->_M_dataplus)._M_p;
        local_220.field_2._M_allocated_capacity = psVar11->_M_string_length;
        local_220._M_dataplus._M_p = (pointer)0x30;
        local_220._M_string_length = 0x6f0528;
        local_200 = 0xe;
        local_1f8 = "\nat this time.";
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_220;
        cmCatViews_abi_cxx11_(&local_190,views_01);
        std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
      }
    }
    else {
      local_d0 = false;
      bVar6 = cmMakefile::ExecuteCommand
                        (this,&local_1a8,local_1e0,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0);
      if (local_d0 == true) {
        local_d0 = false;
        if (local_f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f0._M_value + 0x10)) {
          operator_delete((void *)local_f0._M_value._M_dataplus._M_p,local_f0._16_8_ + 1);
        }
      }
    }
    if (local_1a8.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.Impl.
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_1d8);
    if (local_c8.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      local_c8.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      if (local_c8.DeferId.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          ((pointer)
          ((long)&local_c8.DeferId.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          + 0x10U))._M_p) {
        operator_delete((void *)local_c8.DeferId.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        local_c8.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.FilePath._M_dataplus._M_p != &local_c8.FilePath.field_2) {
      operator_delete(local_c8.FilePath._M_dataplus._M_p,
                      local_c8.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Name._M_dataplus._M_p != &local_c8.Name.field_2) {
      operator_delete(local_c8.Name._M_dataplus._M_p,local_c8.Name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  else {
    local_c8.Name.field_2._8_8_ = (local_1e8->_M_dataplus)._M_p;
    local_c8.Name.field_2._M_allocated_capacity = local_1e8->_M_string_length;
    local_c8.Name._M_dataplus._M_p = (pointer)0x1b;
    local_c8.Name._M_string_length = 0x6f050c;
    views._M_len = 2;
    views._M_array = (iterator)&local_c8;
    cmCatViews_abi_cxx11_(&local_220,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002c08f2:
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmCMakeLanguageCommandCALL(std::vector<cmListFileArgument> const& args,
                                std::string const& callCommand,
                                size_t startArg, cm::optional<Defer> defer,
                                cmExecutionStatus& status)
{
  // ensure specified command is valid
  // start/end flow control commands are not allowed
  auto cmd = cmSystemTools::LowerCase(callCommand);
  if (std::find(InvalidCommands.cbegin(), InvalidCommands.cend(), cmd) !=
      InvalidCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }
  if (defer &&
      std::find(InvalidDeferCommands.cbegin(), InvalidDeferCommands.cend(),
                cmd) != InvalidDeferCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }

  cmMakefile& makefile = status.GetMakefile();
  cmListFileContext context = makefile.GetBacktrace().Top();

  std::vector<cmListFileArgument> funcArgs;
  funcArgs.reserve(args.size() - startArg);

  // The rest of the arguments are passed to the function call above
  for (size_t i = startArg; i < args.size(); ++i) {
    funcArgs.emplace_back(args[i].Value, args[i].Delim, context.Line);
  }
  cmListFileFunction func{ callCommand, context.Line, context.Line,
                           std::move(funcArgs) };

  if (defer) {
    if (defer->Id.empty()) {
      defer->Id = makefile.NewDeferId();
    }
    if (!defer->IdVar.empty()) {
      makefile.AddDefinition(defer->IdVar, defer->Id);
    }
    cmMakefile* deferMakefile =
      defer->Directory ? defer->Directory : &makefile;
    if (!deferMakefile->DeferCall(defer->Id, context.FilePath, func)) {
      return FatalError(
        status,
        cmStrCat("DEFER CALL may not be scheduled in directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    return true;
  }
  return makefile.ExecuteCommand(func, status);
}